

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O0

int archive_read_support_filter_lzop(archive *_a)

{
  int iVar1;
  archive_read *in_RDI;
  int magic_test;
  archive_read_filter_bidder *reader;
  archive_read *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive_read_filter_bidder **in_stack_ffffffffffffffe0;
  archive_read *a_00;
  int local_4;
  
  a_00 = in_RDI;
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    iVar1 = __archive_read_get_bidder(a_00,in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      *in_stack_ffffffffffffffe0 = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[2] = (archive_read_filter_bidder *)lzop_bidder_bid;
      in_stack_ffffffffffffffe0[3] = (archive_read_filter_bidder *)lzop_bidder_init;
      in_stack_ffffffffffffffe0[4] = (archive_read_filter_bidder *)0x0;
      in_stack_ffffffffffffffe0[5] = (archive_read_filter_bidder *)0x0;
      archive_set_error(&in_RDI->archive,-1,"Using external lzop program for lzop decompression");
      local_4 = -0x14;
    }
    else {
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_support_filter_lzop(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *reader;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_lzop");

	if (__archive_read_get_bidder(a, &reader) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	reader->data = NULL;
	reader->bid = lzop_bidder_bid;
	reader->init = lzop_bidder_init;
	reader->options = NULL;
	reader->free = NULL;
	/* Signal the extent of lzop support with the return value here. */
#if defined(HAVE_LZO_LZOCONF_H) && defined(HAVE_LZO_LZO1X_H)
	return (ARCHIVE_OK);
#else
	/* Return ARCHIVE_WARN since this always uses an external program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzop program for lzop decompression");
	return (ARCHIVE_WARN);
#endif
}